

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

uint64_t __thiscall
leveldb::VersionSet::ApproximateOffsetOf(VersionSet *this,Version *v,InternalKey *ikey)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar1;
  Snapshot *pSVar2;
  size_type sVar3;
  FileMetaData *pFVar4;
  int iVar5;
  pointer ppFVar6;
  Iterator *pIVar7;
  uint64_t uVar8;
  ulong uVar9;
  Table *tableptr;
  pointer local_78;
  Snapshot *pSStack_70;
  uint64_t local_68;
  long local_60;
  InternalKeyComparator *local_58;
  Table *local_50;
  size_type local_48;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_40;
  VersionSet *local_38;
  
  local_40 = v->files_;
  local_58 = &this->icmp_;
  local_60 = 0;
  local_68 = 0;
  local_38 = this;
  do {
    ppFVar6 = local_40[local_60].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_40[local_60].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar6) {
      pvVar1 = local_40 + local_60;
      uVar9 = 0;
      do {
        pSVar2 = (Snapshot *)(ppFVar6[uVar9]->largest).rep_._M_string_length;
        if (pSVar2 == (Snapshot *)0x0) {
LAB_00119873:
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        local_78 = (ppFVar6[uVar9]->largest).rep_._M_dataplus._M_p;
        sVar3 = (ikey->rep_)._M_string_length;
        pSStack_70 = pSVar2;
        if (sVar3 == 0) goto LAB_00119873;
        local_50 = (Table *)(ikey->rep_)._M_dataplus._M_p;
        local_48 = sVar3;
        iVar5 = (*(local_58->super_Comparator)._vptr_Comparator[2])
                          (local_58,(ReadOptions *)&local_78,&local_50);
        pFVar4 = (pvVar1->
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar9];
        if (iVar5 < 1) {
          local_68 = local_68 + pFVar4->file_size;
        }
        else {
          pSVar2 = (Snapshot *)(pFVar4->smallest).rep_._M_string_length;
          if (pSVar2 == (Snapshot *)0x0) goto LAB_00119873;
          local_78 = (pFVar4->smallest).rep_._M_dataplus._M_p;
          sVar3 = (ikey->rep_)._M_string_length;
          pSStack_70 = pSVar2;
          if (sVar3 == 0) goto LAB_00119873;
          local_50 = (Table *)(ikey->rep_)._M_dataplus._M_p;
          local_48 = sVar3;
          iVar5 = (*(local_58->super_Comparator)._vptr_Comparator[2])
                            (local_58,(ReadOptions *)&local_78,&local_50);
          if (iVar5 < 1) {
            local_78 = (pointer)0x100;
            pSStack_70 = (Snapshot *)0x0;
            pFVar4 = (pvVar1->
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar9];
            pIVar7 = TableCache::NewIterator
                               (local_38->table_cache_,(ReadOptions *)&local_78,pFVar4->number,
                                pFVar4->file_size,&local_50);
            if (local_50 != (Table *)0x0) {
              pSVar2 = (Snapshot *)(ikey->rep_)._M_string_length;
              if (pSVar2 == (Snapshot *)0x0) goto LAB_00119873;
              local_78 = (ikey->rep_)._M_dataplus._M_p;
              pSStack_70 = pSVar2;
              uVar8 = Table::ApproximateOffsetOf(local_50,(Slice *)&local_78);
              local_68 = local_68 + uVar8;
            }
            if (pIVar7 != (Iterator *)0x0) {
              (*pIVar7->_vptr_Iterator[1])(pIVar7);
            }
          }
          else if (local_60 != 0) break;
        }
        uVar9 = uVar9 + 1;
        ppFVar6 = (pvVar1->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(pvVar1->
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >>
                              3));
    }
    local_60 = local_60 + 1;
    if (local_60 == 7) {
      return local_68;
    }
  } while( true );
}

Assistant:

uint64_t VersionSet::ApproximateOffsetOf(Version* v, const InternalKey& ikey) {
  uint64_t result = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = v->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      if (icmp_.Compare(files[i]->largest, ikey) <= 0) {
        // Entire file is before "ikey", so just add the file size
        result += files[i]->file_size;
      } else if (icmp_.Compare(files[i]->smallest, ikey) > 0) {
        // Entire file is after "ikey", so ignore
        if (level > 0) {
          // Files other than level 0 are sorted by meta->smallest, so
          // no further files in this level will contain data for
          // "ikey".
          break;
        }
      } else {
        // "ikey" falls in the range for this table.  Add the
        // approximate offset of "ikey" within the table.
        Table* tableptr;
        Iterator* iter = table_cache_->NewIterator(
            ReadOptions(), files[i]->number, files[i]->file_size, &tableptr);
        if (tableptr != nullptr) {
          result += tableptr->ApproximateOffsetOf(ikey.Encode());
        }
        delete iter;
      }
    }
  }
  return result;
}